

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 *end;
  uint8 *start;
  int byte_size;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  iVar1 = (*this->_vptr_MessageLite[0xc])();
  if (size < iVar1) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (*this->_vptr_MessageLite[0xe])(this,data);
    if (CONCAT44(extraout_var,iVar2) - (long)data != (long)iVar1) {
      iVar3 = (*this->_vptr_MessageLite[0xc])();
      anon_unknown_12::ByteSizeConsistencyError
                ((long)iVar1,CONCAT44(extraout_var_00,iVar3),
                 CONCAT44(extraout_var,iVar2) - (long)data,this);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  int byte_size = ByteSizeLong();
  if (size < byte_size) return false;
  uint8* start = reinterpret_cast<uint8*>(data);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSizeLong(), end - start, *this);
  }
  return true;
}